

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
dg::vr::StructureAnalyzer::getInvalidatedAreas
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,StructureAnalyzer *this,
          vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
          *instructions)

{
  pointer ppIVar1;
  Instruction *ptr;
  VRLocation *location;
  pointer ppIVar2;
  VRInstruction vrinst;
  allocator_type local_49;
  VRInstruction local_48;
  
  local_48.super_VROp._vptr_VROp = (_func_int **)CONCAT71(local_48.super_VROp._vptr_VROp._1_7_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,*(long *)(this + 0xc0) - *(long *)(this + 0xb8) >> 5,
             (bool *)&local_48,&local_49);
  ppIVar1 = (instructions->
            super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (instructions->
                 super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    ptr = *ppIVar2;
    location = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 8),ptr);
    local_48.super_VROp.type = INSTRUCTION;
    local_48.super_VROp._vptr_VROp = (_func_int **)&PTR__VROp_00136d60;
    local_48.instruction = ptr;
    setValidAreasByInstruction(this,location,__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> StructureAnalyzer::getInvalidatedAreas(
        const std::vector<const llvm::Instruction *> &instructions) const {
    std::vector<bool> validAreas(allocatedAreas.size(), true);

    for (const llvm::Instruction *inst : instructions) {
        VRLocation &location = codeGraph.getVRLocation(inst);
        VRInstruction vrinst(inst);

        setValidAreasByInstruction(location, validAreas, &vrinst);
    }
    return validAreas;
}